

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

DynamicType * __thiscall
Js::JavascriptLibrary::CreateObjectType
          (JavascriptLibrary *this,RecyclableObject *prototype,TypeId typeId,
          uint16 requestedInlineSlotCapacity)

{
  Type TVar1;
  ushort uVar2;
  ScriptContext *pSVar3;
  ScriptContext *pSVar4;
  code *pcVar5;
  DynamicType *pDVar6;
  bool bVar7;
  bool bVar8;
  uint16 offsetOfInlineSlots;
  Type TVar9;
  ushort uVar10;
  int iVar11;
  undefined4 *puVar12;
  DynamicTypeHandler *pDVar13;
  undefined6 in_register_0000000a;
  char16_t *pcVar14;
  char16_t_conflict local_858 [4];
  char16 reason [1024];
  DynamicType *local_38;
  DynamicType *dynamicType;
  
  bVar7 = FunctionBody::DoObjectHeaderInliningForConstructor
                    ((uint32)CONCAT62(in_register_0000000a,requestedInlineSlotCapacity));
  offsetOfInlineSlots = 0x20;
  if (bVar7) {
    offsetOfInlineSlots = DynamicTypeHandler::GetOffsetOfObjectHeaderInlineSlots();
  }
  local_38 = (DynamicType *)0x0;
  pSVar3 = (((((prototype->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  swprintf_s(local_858,0x400,(char16_t_conflict *)L"Cache not populated.");
  if (typeId != TypeIds_Object) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1a90,"(typeId == TypeIds_Object)",
                                "CreateObjectType() is used to create other objects. Please update cacheSlot for protoObjectCache first."
                               );
    if (!bVar8) goto LAB_00aa9be9;
    *puVar12 = 0;
  }
  if ((((pSVar3 == pSVar4) &&
       (iVar11 = (*(prototype->super_FinalizableObject).super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[0x14])
                           (prototype,prototype,0,&local_38,0,
                            (this->super_JavascriptLibraryBase).scriptContext.ptr), iVar11 != 0)) &&
      (local_38 != (DynamicType *)0x0)) &&
     (local_38 != (DynamicType *)(this->super_JavascriptLibraryBase).undefinedValue.ptr)) {
    pDVar13 = (local_38->typeHandler).ptr;
    bVar8 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(pDVar13);
    if (bVar7 != bVar8) {
LAB_00aa9b41:
      bVar8 = Phases::IsEnabled((Phases *)&DAT_01453738,TypeShareForChangePrototypePhase);
      if ((bVar8) && (DAT_0145948a == '\x01')) {
        bVar8 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(pDVar13);
        if (bVar7 == bVar8) {
          uVar2 = pDVar13->inlineSlotCapacity;
          if (bVar7) {
            uVar10 = DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity
                               (requestedInlineSlotCapacity);
          }
          else {
            uVar10 = DynamicTypeHandler::RoundUpInlineSlotCapacity(requestedInlineSlotCapacity);
          }
          swprintf_s(local_858,0x400,
                     (char16_t_conflict *)L"inlineSlotCapacity mismatch. Required = %d, Cached = %d"
                     ,(ulong)uVar10,(ulong)uVar2);
        }
        else {
          swprintf_s(local_858,0x400,(char16_t_conflict *)L"useObjectHeaderInlining mismatch.");
        }
      }
      goto LAB_00aa9885;
    }
    TVar1 = pDVar13->inlineSlotCapacity;
    reason._2040_8_ = pDVar13;
    if (bVar7) {
      TVar9 = DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity
                        (requestedInlineSlotCapacity);
    }
    else {
      TVar9 = DynamicTypeHandler::RoundUpInlineSlotCapacity(requestedInlineSlotCapacity);
    }
    pDVar13 = (DynamicTypeHandler *)reason._2040_8_;
    if (TVar1 != TVar9) goto LAB_00aa9b41;
    if (local_38->isShared == false) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar12 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x1aa5,"(dynamicType->GetIsShared())",
                                  "dynamicType->GetIsShared()");
      if (!bVar7) {
LAB_00aa9be9:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar12 = 0;
    }
    bVar7 = Phases::IsEnabled((Phases *)&DAT_01453738,TypeShareForChangePrototypePhase);
    if (!bVar7) {
      return local_38;
    }
    bVar7 = Phases::IsEnabled((Phases *)&DAT_01453738,TypeShareForChangePrototypePhase);
    if ((bVar7) && (DAT_0145948a == '\x01')) {
      Output::Print(L"TypeSharing: Reusing prototype [0x%p] object\'s InlineSlot cache 0x%p in CreateObject.\n"
                    ,prototype,local_38);
      goto LAB_00aa9a52;
    }
    pcVar14 = L"TypeSharing: Reusing prototype object\'s InlineSlot cache in __proto__.\n";
  }
  else {
LAB_00aa9885:
    bVar7 = Phases::IsEnabled((Phases *)&DAT_01453738,TypeShareForChangePrototypePhase);
    if ((bVar7) && (DAT_0145948a == '\x01')) {
      if (local_38 == (DynamicType *)0x0) {
        pcVar14 = L"cached type was null";
      }
      else {
        if (local_38 != (DynamicType *)(this->super_JavascriptLibraryBase).undefinedValue.ptr)
        goto LAB_00aa9965;
        pcVar14 = L"cached type was undefined";
      }
      swprintf_s(local_858,0x400,(char16_t_conflict *)pcVar14);
    }
LAB_00aa9965:
    pDVar6 = local_38;
    pDVar13 = (DynamicTypeHandler *)
              PathTypeHandlerNoAttr::New
                        ((this->super_JavascriptLibraryBase).scriptContext.ptr,(this->rootPath).ptr,
                         0,requestedInlineSlotCapacity,offsetOfInlineSlots,true,true,
                         (DynamicType *)0x0);
    local_38 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,typeId,
                                prototype,RecyclableObject::DefaultEntryPoint,pDVar13,true,true);
    if (pSVar3 != pSVar4) {
      return local_38;
    }
    (*(prototype->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x19])(prototype,0,local_38,8,0);
    bVar7 = Phases::IsEnabled((Phases *)&DAT_01453738,TypeShareForChangePrototypePhase);
    if (!bVar7) {
      return local_38;
    }
    bVar7 = Phases::IsEnabled((Phases *)&DAT_01453738,TypeShareForChangePrototypePhase);
    if ((bVar7) && (DAT_0145948a == '\x01')) {
      Output::Print(L"TypeSharing: Updating prototype [0x%p] object\'s InlineSlot cache from 0x%p to 0x%p in CreateObject. Reason = %s\n"
                    ,prototype,pDVar6,local_38,local_858);
      goto LAB_00aa9a52;
    }
    pcVar14 = L"TypeSharing: Updating prototype object\'s InlineSlot cache in CreateObject.\n";
  }
  Output::Print(pcVar14);
LAB_00aa9a52:
  Output::Flush();
  return local_38;
}

Assistant:

DynamicType* JavascriptLibrary::CreateObjectType(RecyclableObject* prototype, Js::TypeId typeId, uint16 requestedInlineSlotCapacity)
    {
        const bool useObjectHeaderInlining = FunctionBody::DoObjectHeaderInliningForConstructor(requestedInlineSlotCapacity);
        const uint16 offsetOfInlineSlots =
            useObjectHeaderInlining
            ? DynamicTypeHandler::GetOffsetOfObjectHeaderInlineSlots()
            : sizeof(DynamicObject);

        DynamicType* dynamicType = nullptr;
        const bool useCache = prototype->GetScriptContext() == this->scriptContext;
#if DBG
        DynamicType* oldCachedType = nullptr;
        char16 reason[1024];
        swprintf_s(reason, 1024, _u("Cache not populated."));
#endif
        // Always use `TypeOfPrototypeObjectInlined` because we are creating DynamicType of TypeIds_Object
        AssertMsg(typeId == TypeIds_Object, "CreateObjectType() is used to create other objects. Please update cacheSlot for protoObjectCache first.");

        if (useCache &&
            prototype->GetInternalProperty(prototype, Js::InternalPropertyIds::TypeOfPrototypeObjectInlined, (Js::Var*) &dynamicType, nullptr, this->scriptContext))
        {
            //If the prototype is externalObject, then ExternalObject::Reinitialize can set all the properties to undefined in navigation scenario.
            //Check to make sure dynamicType which is stored as a Js::Var is not undefined.
            //See Blue 419324
            if (dynamicType != nullptr && (Js::Var)dynamicType != this->GetUndefined())
            {
                DynamicTypeHandler *const dynamicTypeHandler = dynamicType->GetTypeHandler();
                if (dynamicTypeHandler->IsObjectHeaderInlinedTypeHandler() == useObjectHeaderInlining &&
                    (
                        dynamicTypeHandler->GetInlineSlotCapacity() ==
                        (
                            useObjectHeaderInlining
                            ? DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(requestedInlineSlotCapacity)
                            : DynamicTypeHandler::RoundUpInlineSlotCapacity(requestedInlineSlotCapacity)
                            )
                        ))
                {
                    Assert(dynamicType->GetIsShared());

                    if (PHASE_TRACE1(TypeShareForChangePrototypePhase))
                    {
#if DBG
                        if (PHASE_VERBOSE_TRACE1(TypeShareForChangePrototypePhase))
                        {
                            Output::Print(_u("TypeSharing: Reusing prototype [0x%p] object's InlineSlot cache 0x%p in CreateObject.\n"), prototype, dynamicType);
                        }
                        else
                        {
#endif
                            Output::Print(_u("TypeSharing: Reusing prototype object's InlineSlot cache in __proto__.\n"));
#if DBG
                        }
#endif
                        Output::Flush();
                    }

                    return dynamicType;
                }
#if DBG
                if (PHASE_VERBOSE_TRACE1(TypeShareForChangePrototypePhase))
                {
                    if (dynamicTypeHandler->IsObjectHeaderInlinedTypeHandler() != useObjectHeaderInlining)
                    {
                        swprintf_s(reason, 1024, _u("useObjectHeaderInlining mismatch."));
                    }
                    else
                    {
                        uint16 cachedCapacity = dynamicTypeHandler->GetInlineSlotCapacity();
                        uint16 requiredCapacity = useObjectHeaderInlining
                            ? DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(requestedInlineSlotCapacity)
                            : DynamicTypeHandler::RoundUpInlineSlotCapacity(requestedInlineSlotCapacity);

                        swprintf_s(reason, 1024, _u("inlineSlotCapacity mismatch. Required = %d, Cached = %d"), requiredCapacity, cachedCapacity);
                    }
                }
#endif
            }

        }

#if DBG
        if (PHASE_VERBOSE_TRACE1(TypeShareForChangePrototypePhase))
        {
            if (dynamicType == nullptr)
            {
                swprintf_s(reason, 1024, _u("cached type was null"));
            }
            else if ((Js::Var)dynamicType == this->GetUndefined())
            {
                swprintf_s(reason, 1024, _u("cached type was undefined"));
            }
        }
        oldCachedType = dynamicType;
#endif
        PathTypeHandlerNoAttr* typeHandler = PathTypeHandlerNoAttr::New(scriptContext, this->GetRootPath(), 0, requestedInlineSlotCapacity, offsetOfInlineSlots, true, true);
        dynamicType = DynamicType::New(scriptContext, typeId, prototype, RecyclableObject::DefaultEntryPoint, typeHandler, true, true);

        if (useCache)
        {
            prototype->SetInternalProperty(Js::InternalPropertyIds::TypeOfPrototypeObjectInlined, (Var)dynamicType, PropertyOperationFlags::PropertyOperation_Force, nullptr);
            if (PHASE_TRACE1(TypeShareForChangePrototypePhase))
            {
#if DBG
                if (PHASE_VERBOSE_TRACE1(TypeShareForChangePrototypePhase))
                {
                    Output::Print(_u("TypeSharing: Updating prototype [0x%p] object's InlineSlot cache from 0x%p to 0x%p in CreateObject. Reason = %s\n"), prototype, oldCachedType, dynamicType, reason);
                }
                else
                {
#endif
                    Output::Print(_u("TypeSharing: Updating prototype object's InlineSlot cache in CreateObject.\n"));
#if DBG
                }
#endif
                Output::Flush();
            }
        }

        return dynamicType;
    }